

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O0

void PrintEnterBlock(ParseGraphContext *ctx,char *name,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list args;
  char *format_local;
  char *name_local;
  ParseGraphContext *ctx_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  args[0].reg_save_area = format;
  PrintIndent(ctx);
  if (*name != '\0') {
    OutputContext::Print(ctx->output,name);
    OutputContext::Print(ctx->output,": ");
  }
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_38._4_4_ = 0x30;
  local_38._0_4_ = 0x18;
  OutputContext::Print(ctx->output,(char *)args[0].reg_save_area,(__va_list_tag *)local_38);
  OutputContext::Print(ctx->output,"{\n");
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ParseGraphContext &ctx, const char *name, const char *format, ...)
{
	PrintIndent(ctx);

	if(*name)
	{
		ctx.output.Print(name);
		ctx.output.Print(": ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print("{\n");

	ctx.depth++;
}